

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Float pbrt::SphericalQuadArea(Vector3f *a,Vector3f *b,Vector3f *c,Vector3f *d)

{
  undefined1 auVar1 [16];
  Float FVar2;
  Float FVar3;
  Float FVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar18 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 in_ZMM1 [64];
  undefined1 auVar23 [60];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Vector3<float> VVar27;
  Tuple3<pbrt::Vector3,_float> local_a8;
  undefined1 local_98 [16];
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  Tuple3<pbrt::Vector3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  auVar23 = in_ZMM1._4_60_;
  auVar18 = in_ZMM0._8_56_;
  VVar27 = Cross<float>(a,b);
  fVar19 = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar18;
  local_98 = auVar10._0_16_;
  local_58._0_8_ = vmovlps_avx(local_98);
  local_58.z = fVar19;
  VVar27 = Cross<float>(b,c);
  fVar20 = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar18;
  local_38 = auVar11._0_16_;
  local_68._0_8_ = vmovlps_avx(local_38);
  local_68.z = fVar20;
  VVar27 = Cross<float>(c,d);
  fVar21 = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar18;
  local_48 = auVar12._0_16_;
  local_78._0_8_ = vmovlps_avx(local_48);
  local_78.z = fVar21;
  VVar27 = Cross<float>(d,a);
  auVar22._0_4_ = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._4_60_ = auVar23;
  auVar13._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar18;
  auVar5 = auVar13._0_16_;
  local_88._0_8_ = vmovlps_avx(auVar5);
  auVar1._0_4_ = local_98._0_4_ * local_98._0_4_;
  auVar1._4_4_ = local_98._4_4_ * local_98._4_4_;
  auVar1._8_4_ = local_98._8_4_ * local_98._8_4_;
  auVar1._12_4_ = local_98._12_4_ * local_98._12_4_;
  auVar1 = vmovshdup_avx(auVar1);
  auVar1 = vfmadd231ss_fma(auVar1,local_98,local_98);
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  FVar2 = 0.0;
  if ((auVar1._0_4_ != 0.0) || (NAN(auVar1._0_4_))) {
    auVar24._0_4_ = local_38._0_4_ * local_38._0_4_;
    auVar24._4_4_ = local_38._4_4_ * local_38._4_4_;
    auVar24._8_4_ = local_38._8_4_ * local_38._8_4_;
    auVar24._12_4_ = local_38._12_4_ * local_38._12_4_;
    auVar1 = vmovshdup_avx(auVar24);
    auVar1 = vfmadd231ss_fma(auVar1,local_38,local_38);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),auVar1);
    FVar2 = 0.0;
    if ((auVar1._0_4_ != 0.0) || (NAN(auVar1._0_4_))) {
      auVar25._0_4_ = local_48._0_4_ * local_48._0_4_;
      auVar25._4_4_ = local_48._4_4_ * local_48._4_4_;
      auVar25._8_4_ = local_48._8_4_ * local_48._8_4_;
      auVar25._12_4_ = local_48._12_4_ * local_48._12_4_;
      auVar1 = vmovshdup_avx(auVar25);
      auVar1 = vfmadd231ss_fma(auVar1,local_48,local_48);
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21),auVar1);
      FVar2 = 0.0;
      if ((auVar1._0_4_ != 0.0) || (NAN(auVar1._0_4_))) {
        auVar26._0_4_ =
             VVar27.super_Tuple3<pbrt::Vector3,_float>.x *
             VVar27.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar26._4_4_ =
             VVar27.super_Tuple3<pbrt::Vector3,_float>.y *
             VVar27.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar26._8_4_ = auVar18._0_4_ * auVar18._0_4_;
        auVar26._12_4_ = auVar18._4_4_ * auVar18._4_4_;
        auVar1 = vmovshdup_avx(auVar26);
        auVar1 = vfmadd231ss_fma(auVar1,auVar5,auVar5);
        auVar1 = vfmadd213ss_fma(auVar22._0_16_,auVar22._0_16_,auVar1);
        FVar2 = 0.0;
        if ((auVar1._0_4_ != 0.0) || (NAN(auVar1._0_4_))) {
          local_88.z = auVar22._0_4_;
          VVar27 = Normalize<float>((Vector3<float> *)&local_58);
          local_58.z = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar14._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar14._8_56_ = auVar18;
          local_58._0_8_ = vmovlps_avx(auVar14._0_16_);
          VVar27 = Normalize<float>((Vector3<float> *)&local_68);
          local_68.z = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar15._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar15._8_56_ = auVar18;
          local_68._0_8_ = vmovlps_avx(auVar15._0_16_);
          VVar27 = Normalize<float>((Vector3<float> *)&local_78);
          local_78.z = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar16._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar16._8_56_ = auVar18;
          local_78._0_8_ = vmovlps_avx(auVar16._0_16_);
          VVar27 = Normalize<float>((Vector3<float> *)&local_88);
          local_88.z = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar17._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar17._8_56_ = auVar18;
          local_88._0_8_ = vmovlps_avx(auVar17._0_16_);
          auVar6._0_8_ = local_58._0_8_ ^ 0x8000000080000000;
          auVar6._8_4_ = 0x80000000;
          auVar6._12_4_ = 0x80000000;
          local_a8.z = -local_58.z;
          local_a8._0_8_ = vmovlps_avx(auVar6);
          FVar2 = AngleBetween<float>((Vector3<float> *)&local_88,(Vector3<float> *)&local_a8);
          auVar7._0_8_ = local_68._0_8_ ^ 0x8000000080000000;
          auVar7._8_4_ = 0x80000000;
          auVar7._12_4_ = 0x80000000;
          local_a8.z = -local_68.z;
          local_a8._0_8_ = vmovlps_avx(auVar7);
          FVar3 = AngleBetween<float>((Vector3<float> *)&local_58,(Vector3<float> *)&local_a8);
          local_98._0_4_ = FVar3;
          auVar8._0_8_ = local_78._0_8_ ^ 0x8000000080000000;
          auVar8._8_4_ = 0x80000000;
          auVar8._12_4_ = 0x80000000;
          local_a8.z = -local_78.z;
          local_a8._0_8_ = vmovlps_avx(auVar8);
          FVar3 = AngleBetween<float>((Vector3<float> *)&local_68,(Vector3<float> *)&local_a8);
          auVar9._0_8_ = local_88._0_8_ ^ 0x8000000080000000;
          auVar9._8_4_ = 0x80000000;
          auVar9._12_4_ = 0x80000000;
          local_a8.z = -local_88.z;
          local_a8._0_8_ = vmovlps_avx(auVar9);
          FVar4 = AngleBetween<float>((Vector3<float> *)&local_78,(Vector3<float> *)&local_a8);
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar1 = vandps_avx512vl(ZEXT416((uint)((float)local_98._0_4_ + FVar2 + FVar3 + FVar4 +
                                                 -6.2831855)),auVar5);
          FVar2 = auVar1._0_4_;
        }
      }
    }
  }
  return FVar2;
}

Assistant:

PBRT_CPU_GPU
inline Float SphericalQuadArea(const Vector3f &a, const Vector3f &b, const Vector3f &c,
                               const Vector3f &d) {
    Vector3f axb = Cross(a, b), bxc = Cross(b, c);
    Vector3f cxd = Cross(c, d), dxa = Cross(d, a);
    if (LengthSquared(axb) == 0 || LengthSquared(bxc) == 0 || LengthSquared(cxd) == 0 ||
        LengthSquared(dxa) == 0)
        return 0;
    axb = Normalize(axb);
    bxc = Normalize(bxc);
    cxd = Normalize(cxd);
    dxa = Normalize(dxa);

    Float alpha = AngleBetween(dxa, -axb);
    Float beta = AngleBetween(axb, -bxc);
    Float gamma = AngleBetween(bxc, -cxd);
    Float delta = AngleBetween(cxd, -dxa);

    return std::abs(alpha + beta + gamma + delta - 2 * Pi);
}